

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void StyleToHead(TidyDocImpl *doc,Node *head,Node *node,Bool fix,int indent)

{
  Node **ppNVar1;
  Node *pNVar2;
  uint code;
  
  while (node != (Node *)0x0) {
    pNVar2 = node->next;
    if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_STYLE)) {
      ppNVar1 = &node->content;
      node = pNVar2;
      if (*ppNVar1 != (Node *)0x0) {
        StyleToHead(doc,head,*ppNVar1,fix,indent + 1);
      }
    }
    else {
      if (fix == no) {
        code = 0x241;
      }
      else {
        prvTidyRemoveNode(node);
        prvTidyInsertNodeAtEnd(head,node);
        code = 0x263;
      }
      prvTidyReport(doc,node,head,code);
      node = pNVar2;
    }
  }
  return;
}

Assistant:

static void StyleToHead(TidyDocImpl* doc, Node *head, Node *node, Bool fix, int indent)
{
	Node *next;
	while (node)
	{
		next = node->next;	/* get 'next' now , in case the node is moved */
		/* dbg_show_node(doc, node, 0, indent); */
		if (nodeIsSTYLE(node))
		{
			if (fix)
			{
				TY_(RemoveNode)(node); /* unhook style node from body */
				TY_(InsertNodeAtEnd)(head, node);   /* add to end of head */
				TY_(Report)(doc, node, head, MOVED_STYLE_TO_HEAD); /* report move */
			}
			else
			{
				TY_(Report)(doc, node, head, FOUND_STYLE_IN_BODY);
			}
		}
		else if (node->content)
		{
			StyleToHead(doc, head, node->content, fix, indent + 1);
		}
		node = next;	/* process the 'next', if any */
	}
}